

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-attack.c
# Opt level: O1

void monster_get_target_dist_grid(monster_conflict *mon,int *dist,loc *grid)

{
  _Bool _Var1;
  wchar_t wVar2;
  loc grid2;
  
  _Var1 = monster_is_decoyed((monster *)mon);
  if (_Var1) {
    grid2 = cave_find_decoy(cave);
    if (dist != (int *)0x0) {
      wVar2 = distance((loc_conflict)mon->grid,(loc_conflict)grid2);
      *dist = wVar2;
    }
    if (grid == (loc *)0x0) {
      return;
    }
  }
  else {
    if (dist != (int *)0x0) {
      *dist = (uint)mon->cdis;
    }
    if (grid == (loc *)0x0) {
      return;
    }
    grid2.x = (player->grid).x;
    grid2.y = (player->grid).y;
  }
  *grid = grid2;
  return;
}

Assistant:

static void monster_get_target_dist_grid(struct monster *mon, int *dist,
										 struct loc *grid)
{
	if (monster_is_decoyed(mon)) {
		struct loc decoy = cave_find_decoy(cave);
		if (dist) {
			*dist = distance(mon->grid, decoy);
		}
		if (grid) {
			*grid = decoy;
		}
	} else {
		if (dist) {
			*dist = mon->cdis;
		}
		if (grid) {
			*grid = player->grid;
		}
	}
}